

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void libclient::main_client_thread(void)

{
  char **name;
  undefined **ppuVar1;
  bind_t<void,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_boost::_bi::list1<boost::_bi::value<char_*>_>_>
  threadfunc;
  thread_group threads;
  subsecond_duration<boost::posix_time::time_duration,_1000L> local_178;
  thread_group local_170;
  
  boost::thread_group::thread_group(&local_170);
  for (ppuVar1 = &PTR_anon_var_dwarf_2b24b_0012e9c0;
      ((storage1<boost::_bi::value<char_*>_> *)ppuVar1)->a1_ != (value<char_*>)0x0;
      ppuVar1 = (undefined **)((storage1<boost::_bi::value<char_*>_> *)ppuVar1 + 1)) {
    threadfunc.l_.super_storage1<boost::_bi::value<char_*>_>.a1_.t_ =
         (storage1<boost::_bi::value<char_*>_>)
         (value<char_*>)((storage1<boost::_bi::value<char_*>_> *)ppuVar1)->a1_;
    threadfunc.f_ = client_thread;
    boost::thread_group::
    create_thread<boost::_bi::bind_t<void,void(*)(std::__cxx11::string_const&),boost::_bi::list1<boost::_bi::value<char*>>>>
              (&local_170,threadfunc);
    local_178.super_time_duration.
    super_time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
    .ticks_.value_ =
         (time_duration)
         (time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
          )0x186a0;
    boost::this_thread::
    sleep<boost::date_time::subsecond_duration<boost::posix_time::time_duration,1000l>>(&local_178);
  }
  boost::thread_group::join_all(&local_170);
  boost::thread_group::~thread_group(&local_170);
  return;
}

Assistant:

void libclient::main_client_thread() {
    boost::thread_group threads;
    char* names[] = { "Amul", "Macho", "SodaWater", "DesiBoy", "Jethalal", "Gyanchand",0 };
    for ( char ** name = names; *name; ++name) 
    {
        threads.create_thread( boost::bind(client_thread, *name));
        boost::this_thread::sleep( boost::posix_time::millisec(100));
    }
    threads.join_all();
}